

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

bool cvui::internal::inputUpdateFocus(int theX,int theY,String *theName,Rect *theRect)

{
  int iVar1;
  int iVar2;
  bool aIsLoseFocusInteraction;
  bool aIsGainFocusInteraction;
  int aOutsideAreaInteraction;
  int aInputAreaInteraction;
  bool aFocused;
  Rect *theRect_local;
  String *theName_local;
  int theY_local;
  int theX_local;
  
  aOutsideAreaInteraction._3_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gInput,
                       theName);
  iVar1 = cvui::iarea(theX,theY,theRect->width,theRect->height);
  iVar2 = cvui::iarea(0,0,10000000,10000000);
  if ((aOutsideAreaInteraction._3_1_) || (iVar1 != 3)) {
    if ((aOutsideAreaInteraction._3_1_) && ((iVar2 == 3 && (iVar1 != 3)))) {
      std::__cxx11::string::operator=((string *)gInput,"");
      aOutsideAreaInteraction._3_1_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)gInput,(string *)theName);
    aOutsideAreaInteraction._3_1_ = true;
  }
  return aOutsideAreaInteraction._3_1_;
}

Assistant:

bool inputUpdateFocus(int theX, int theY, const cv::String& theName, cv::Rect &theRect) {
		bool aFocused = gInput.name == theName;

        int aInputAreaInteraction = cvui::iarea(theX, theY, theRect.width, theRect.height);
		int aOutsideAreaInteraction = cvui::iarea(0, 0, 10000000, 10000000);
        bool aIsGainFocusInteraction = aInputAreaInteraction == cvui::CLICK;
        bool aIsLoseFocusInteraction = aOutsideAreaInteraction == cvui::CLICK;

		if (!aFocused && aIsGainFocusInteraction) {
            gInput.name = theName;
			aFocused = true;
		} else if (aFocused && aIsLoseFocusInteraction && !aIsGainFocusInteraction) {
            gInput.name = "";
			aFocused = false;
		}

        return aFocused;
    }